

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O3

EVP_MD * EVP_parse_digest_algorithm(CBS *cbs)

{
  int iVar1;
  EVP_MD *pEVar2;
  int line;
  CBS algorithm;
  CBS oid;
  CBS param;
  CBS CStack_38;
  CBS local_28;
  CBS local_18;
  
  iVar1 = CBS_get_asn1(cbs,&CStack_38,0x20000010);
  if ((iVar1 == 0) || (iVar1 = CBS_get_asn1(&CStack_38,&local_28,6), iVar1 == 0)) {
    iVar1 = 0x65;
    line = 0x84;
  }
  else {
    pEVar2 = cbs_to_md((CBS *)local_28.data);
    if (pEVar2 == (EVP_MD *)0x0) {
      iVar1 = 0x66;
      line = 0x8a;
    }
    else {
      if (CStack_38.len == 0) {
        return pEVar2;
      }
      iVar1 = CBS_get_asn1(&CStack_38,&local_18,5);
      if (((iVar1 != 0) && (local_18.len == 0)) && (CStack_38.len == 0)) {
        return pEVar2;
      }
      iVar1 = 0x65;
      line = 0x97;
    }
  }
  ERR_put_error(0x1d,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                ,line);
  return (EVP_MD *)0x0;
}

Assistant:

const EVP_MD *EVP_parse_digest_algorithm(CBS *cbs) {
  CBS algorithm, oid;
  if (!CBS_get_asn1(cbs, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&algorithm, &oid, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_DECODE_ERROR);
    return NULL;
  }

  const EVP_MD *ret = cbs_to_md(&oid);
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_UNKNOWN_HASH);
    return NULL;
  }

  // The parameters, if present, must be NULL. Historically, whether the NULL
  // was included or omitted was not well-specified. When parsing an
  // AlgorithmIdentifier, we allow both. (Note this code is not used when
  // verifying RSASSA-PKCS1-v1_5 signatures.)
  if (CBS_len(&algorithm) > 0) {
    CBS param;
    if (!CBS_get_asn1(&algorithm, &param, CBS_ASN1_NULL) ||
        CBS_len(&param) != 0 ||  //
        CBS_len(&algorithm) != 0) {
      OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_DECODE_ERROR);
      return NULL;
    }
  }

  return ret;
}